

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

void __thiscall PatternBlock::PatternBlock(PatternBlock *this,PatternBlock *a,PatternBlock *b)

{
  pointer puVar1;
  int4 iVar2;
  PatternBlock *pPVar3;
  
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar3 = intersect(a,b);
  iVar2 = pPVar3->nonzerosize;
  this->offset = pPVar3->offset;
  this->nonzerosize = iVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->maskvec,&pPVar3->maskvec);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->valvec,&pPVar3->valvec)
  ;
  puVar1 = (pPVar3->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  puVar1 = (pPVar3->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  operator_delete(pPVar3);
  return;
}

Assistant:

PatternBlock::PatternBlock(const PatternBlock *a,const PatternBlock *b)

{				// Construct PatternBlock by ANDing two others together
  PatternBlock *res = a->intersect(b);
  offset = res->offset;
  nonzerosize = res->nonzerosize;
  maskvec = res->maskvec;
  valvec = res->valvec;
  delete res;
}